

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::SmallVector<wasm::Expression_**,_4UL>::push_back
          (SmallVector<wasm::Expression_**,_4UL> *this,Expression ***x)

{
  value_type ppEVar1;
  size_type __n;
  reference pppEVar2;
  Expression ***x_local;
  SmallVector<wasm::Expression_**,_4UL> *this_local;
  
  if (this->usedFixed < 4) {
    ppEVar1 = *x;
    __n = this->usedFixed;
    this->usedFixed = __n + 1;
    pppEVar2 = std::array<wasm::Expression_**,_4UL>::operator[](&this->fixed,__n);
    *pppEVar2 = ppEVar1;
  }
  else {
    std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::push_back
              (&this->flexible,x);
  }
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }